

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
          (UnsignedLongsEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,
          unsigned_long expected,unsigned_long actual,SimpleString *text)

{
  SimpleString *in_RDI;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eHex;
  SimpleString eDecimal;
  SimpleString aHex;
  SimpleString aDecimal;
  SimpleString *in_stack_ffffffffffffff60;
  SimpleString *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  TestFailure *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  TestFailure *in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SimpleString *in_stack_ffffffffffffffa0;
  UtestShell *in_stack_ffffffffffffffa8;
  TestFailure *in_stack_ffffffffffffffb0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c);
  in_RDI->buffer_ = (char *)&PTR__UnsignedLongsEqualFailure_0025db98;
  TestFailure::createUserText(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SimpleString::operator=(in_stack_ffffffffffffff60,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x2116d3);
  StringFrom((unsigned_long)in_RDI);
  HexStringFrom((unsigned_long)in_RDI);
  StringFrom((unsigned_long)in_RDI);
  HexStringFrom((unsigned_long)in_RDI);
  SimpleString::padStringsToSameLength
            (in_stack_ffffffffffffffa0,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff97);
  SimpleString::padStringsToSameLength
            (in_stack_ffffffffffffffa0,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff97);
  SimpleString::SimpleString(in_stack_ffffffffffffff60,(char *)in_RDI);
  SimpleString::operator+((SimpleString *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SimpleString::operator+((SimpleString *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SimpleString::~SimpleString((SimpleString *)0x211792);
  SimpleString::~SimpleString((SimpleString *)0x21179c);
  SimpleString::SimpleString(in_stack_ffffffffffffff60,(char *)in_RDI);
  SimpleString::operator+((SimpleString *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SimpleString::operator+((SimpleString *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SimpleString::~SimpleString((SimpleString *)0x2117e5);
  SimpleString::~SimpleString((SimpleString *)0x2117ef);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SimpleString::operator+=(in_stack_ffffffffffffff60,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x211827);
  SimpleString::~SimpleString((SimpleString *)0x211831);
  SimpleString::~SimpleString((SimpleString *)0x21183b);
  SimpleString::~SimpleString((SimpleString *)0x211845);
  SimpleString::~SimpleString((SimpleString *)0x21184f);
  SimpleString::~SimpleString((SimpleString *)0x211859);
  SimpleString::~SimpleString((SimpleString *)0x211863);
  return;
}

Assistant:

UnsignedLongsEqualFailure::UnsignedLongsEqualFailure(UtestShell* test, const char* fileName, int lineNumber, unsigned long expected, unsigned long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString aHex = HexStringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);
    SimpleString eHex = HexStringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');
    SimpleString::padStringsToSameLength(aHex, eHex, '0');

    SimpleString actualReported = aDecimal + " 0x" + aHex;
    SimpleString expectedReported = eDecimal + " 0x" + eHex;
    message_ += createButWasString(expectedReported, actualReported);
}